

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unicode_filenames.cc
# Opt level: O2

int copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  FILE *__stream;
  FILE *__stream_00;
  size_t __n;
  ostream *poVar2;
  undefined1 auStack_2828 [10248];
  
  __stream = fopen("minimal.pdf","rb");
  __stream_00 = fopen((char *)dst,"wb");
  if ((__stream != (FILE *)0x0) && (__stream_00 != (FILE *)0x0)) {
    while (__n = fread(auStack_2828,1,0x2800,__stream), __n != 0) {
      fwrite(auStack_2828,1,__n,__stream_00);
    }
    fclose(__stream);
    iVar1 = fclose(__stream_00);
    return iVar1;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"errors opening files");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(2);
}

Assistant:

void
copy(char const* outname)
{
    FILE* in = fopen("minimal.pdf", "rb");
    FILE* out = fopen(outname, "wb");
    do_copy(in, out);
}